

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpruned_grid.hpp
# Opt level: O0

spherical_grid_ptr __thiscall
IntegratorXX::detail::generate_unpruned_grid_impl<IntegratorXX::Womersley<double>>
          (detail *this,RadialQuad rq,RadialTraits *traits,Womersley<double> *ang_quad)

{
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  spherical_grid_ptr sVar2;
  RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
  local_f8;
  RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
  local_c8;
  RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
  local_98;
  RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>
  local_58;
  Womersley<double> *local_28;
  Womersley<double> *ang_quad_local;
  RadialTraits *traits_local;
  detail *pdStack_10;
  RadialQuad rq_local;
  
  local_28 = ang_quad;
  ang_quad_local = (Womersley<double> *)traits;
  traits_local._4_4_ = rq;
  pdStack_10 = this;
  if (rq == Becke) {
    RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>
    ::RadialTransformQuadrature(&local_58,traits);
    SphericalGridFactory::
    generate_unpruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Womersley<double>>
              ((SphericalGridFactory *)this,&local_58,local_28);
    RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>
    ::~RadialTransformQuadrature(&local_58);
    _Var1._M_pi = extraout_RDX;
  }
  else if (rq == MurrayHandyLaming) {
    RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
    ::RadialTransformQuadrature(&local_c8,traits);
    SphericalGridFactory::
    generate_unpruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::Womersley<double>>
              ((SphericalGridFactory *)this,&local_c8,local_28);
    RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
    ::~RadialTransformQuadrature(&local_c8);
    _Var1._M_pi = extraout_RDX_01;
  }
  else if (rq == MuraKnowles) {
    RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
    ::RadialTransformQuadrature(&local_98,traits);
    SphericalGridFactory::
    generate_unpruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::Womersley<double>>
              ((SphericalGridFactory *)this,&local_98,local_28);
    RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
    ::~RadialTransformQuadrature(&local_98);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    if (rq != TreutlerAhlrichs) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unsupported Radial Quadrature");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
    ::RadialTransformQuadrature(&local_f8,traits);
    SphericalGridFactory::
    generate_unpruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>
              ((SphericalGridFactory *)this,&local_f8,local_28);
    RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
    ::~RadialTransformQuadrature(&local_f8);
    _Var1._M_pi = extraout_RDX_02;
  }
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (spherical_grid_ptr)
         sVar2.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto generate_unpruned_grid_impl(RadialQuad rq, const RadialTraits& traits,
  AngularQuadType&& ang_quad) {

  switch( rq ) {

    case RadialQuad::Becke:
      return SphericalGridFactory::generate_unpruned_grid( bk_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::MuraKnowles:
      return SphericalGridFactory::generate_unpruned_grid( mk_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::MurrayHandyLaming:
      return SphericalGridFactory::generate_unpruned_grid( mhl_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::TreutlerAhlrichs:
      return SphericalGridFactory::generate_unpruned_grid( ta_type(traits), std::forward<AngularQuadType>(ang_quad) );

    default:
      throw std::runtime_error("Unsupported Radial Quadrature");
      abort();

  }

}